

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall Importer_replaceModel_Test::TestBody(Importer_replaceModel_Test *this)

{
  shared_ptr *psVar1;
  undefined1 uVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ModelPtr rightSourceModel;
  ImporterPtr importer;
  ModelPtr model;
  ModelPtr wrongSourceModel;
  ParserPtr parser;
  long *local_b8;
  AssertionResult local_b0;
  long local_a0 [2];
  long *local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80 [8];
  shared_ptr *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  shared_ptr *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58 [2];
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_68 = (shared_ptr *)local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"importer/generic_no_source.cellml","");
  fileContents((string *)&local_b0);
  libcellml::Parser::parseModel(local_48);
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  if (local_68 != (shared_ptr *)local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_68,0));
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"wrong","");
  libcellml::Model::create(local_38);
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"source","");
  libcellml::Model::create((string *)&local_78);
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  psVar1 = local_78;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"a","");
  libcellml::Component::create((string *)&local_90);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  psVar1 = local_78;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"b","");
  libcellml::Component::create((string *)&local_90);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  psVar1 = local_78;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"c","");
  libcellml::Component::create((string *)&local_90);
  libcellml::ComponentEntity::addComponent(psVar1);
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"d","");
  libcellml::Component::create((string *)&local_90);
  libcellml::ComponentEntity::addComponent(local_78);
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  psVar1 = local_68;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"i_dont_exist.cellml","");
  uVar2 = libcellml::Importer::addModel(psVar1,local_38);
  local_90 = (long *)CONCAT71(local_90._1_7_,uVar2);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  if (local_90._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(char *)&local_90,
               "importer->addModel(wrongSourceModel, \"i_dont_exist.cellml\")","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x199,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_68;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"i_dont_exist.cellml","");
  uVar2 = libcellml::Importer::addModel(psVar1,(string *)&local_78);
  local_90 = (long *)(CONCAT71(local_90._1_7_,uVar2) ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  if (local_90._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(char *)&local_90,
               "importer->addModel(rightSourceModel, \"i_dont_exist.cellml\")","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x19b,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_68;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"not_in_library","");
  uVar2 = libcellml::Importer::replaceModel(psVar1,(string *)&local_78);
  local_90 = (long *)(CONCAT71(local_90._1_7_,uVar2) ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  if (local_90._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(char *)&local_90,
               "importer->replaceModel(rightSourceModel, \"not_in_library\")","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x19e,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_68;
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"i_dont_exist.cellml","");
  uVar2 = libcellml::Importer::replaceModel(psVar1,(string *)&local_78);
  local_90 = (long *)CONCAT71(local_90._1_7_,uVar2);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  if (local_90._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(char *)&local_90,
               "importer->replaceModel(rightSourceModel, \"i_dont_exist.cellml\")","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x19f,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_68;
  pcVar4 = "";
  local_b0._0_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  libcellml::Importer::resolveImports(psVar1,local_48);
  if ((long *)local_b0._0_8_ != local_a0) {
    operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
  }
  local_90 = (long *)0x0;
  local_b8 = (long *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_b0,"size_t(0)","importer->issueCount()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_b8);
  if ((string)local_b0.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_b0.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_b0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1a3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_90 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
      local_90 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_90 = (long *)(CONCAT71(local_90._1_7_,cVar3) ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(char *)&local_90,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x1a4,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0[0] + 1);
    }
    if (local_b8 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Importer, replaceModel)
{
    // This test shows how a model instance can be replaced in the import library by the user,
    // and will be used to resolve imports.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/generic_no_source.cellml"));
    auto importer = libcellml::Importer::create();

    auto wrongSourceModel = libcellml::Model::create("wrong");

    auto rightSourceModel = libcellml::Model::create("source");
    rightSourceModel->addComponent(libcellml::Component::create("a"));
    rightSourceModel->addComponent(libcellml::Component::create("b"));
    rightSourceModel->addComponent(libcellml::Component::create("c"));
    rightSourceModel->addComponent(libcellml::Component::create("d"));

    // Add a model manually to the library, including the URL that it will replace in future imports.
    EXPECT_TRUE(importer->addModel(wrongSourceModel, "i_dont_exist.cellml"));
    // Can't add to the same URL key more than once.
    EXPECT_FALSE(importer->addModel(rightSourceModel, "i_dont_exist.cellml"));

    // Use replaceModel instead.
    EXPECT_FALSE(importer->replaceModel(rightSourceModel, "not_in_library"));
    EXPECT_TRUE(importer->replaceModel(rightSourceModel, "i_dont_exist.cellml"));

    importer->resolveImports(model, "");

    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
}